

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

shared_ptr<chatra::Node> __thiscall
chatra::
extractStatementPiece<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
          (chatra *this,ParserContext *ct,
          __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
          *it,__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
              last,StatementPatternElement *e)

{
  Token **__args_1;
  StringId SVar1;
  pointer pbVar2;
  element_type *peVar3;
  Token *pTVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 uVar7;
  ParserContext *ct_00;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  Token **ppTVar11;
  long *plVar12;
  undefined8 *puVar13;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  _Var14;
  uint *puVar15;
  StatementPatternElement *extraout_RDX;
  StatementPatternElement *extraout_RDX_00;
  StatementPatternElement *extraout_RDX_01;
  StatementPatternElement *extraout_RDX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  StatementPatternElement *extraout_RDX_03;
  StatementPatternElement *extraout_RDX_04;
  StatementPatternElement *extraout_RDX_05;
  StatementPatternElement *extraout_RDX_06;
  StatementPatternElement *extraout_RDX_07;
  StatementPatternElement *extraout_RDX_08;
  StatementPatternElement *extraout_RDX_09;
  StatementPatternElement *extraout_RDX_10;
  StatementPatternElement *extraout_RDX_11;
  StatementPatternElement *extraout_RDX_12;
  StatementPatternElement *extraout_RDX_13;
  StatementPatternElement *extraout_RDX_14;
  StatementPatternElement *extraout_RDX_15;
  StatementPatternElement *extraout_RDX_16;
  StatementPatternElement *extraout_RDX_17;
  StatementPatternElement *extraout_RDX_18;
  StatementPatternElement *extraout_RDX_19;
  StatementPatternElement *extraout_RDX_20;
  StatementPatternElement *extraout_RDX_21;
  StatementPatternElement *extraout_RDX_22;
  StatementPatternElement *extraout_RDX_23;
  StatementPatternElement *extraout_RDX_24;
  StatementPatternElement *extraout_RDX_25;
  StatementPatternElement *extraout_RDX_26;
  StatementPatternElement *extraout_RDX_27;
  StatementPatternElement *extraout_RDX_28;
  StatementPatternElement *extraout_RDX_29;
  StatementPatternElement *extraout_RDX_30;
  StatementPatternElement *extraout_RDX_31;
  StatementPatternElement *extraout_RDX_32;
  byte bVar17;
  int iVar18;
  Node *__tmp;
  Token *pTVar19;
  element_type *peVar20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  shared_ptr<chatra::Node> *psVar21;
  long lVar22;
  shared_ptr<chatra::Node> *node;
  shared_ptr<chatra::Node> sVar23;
  chatra local_1b8 [8];
  element_type *local_1b0;
  chatra local_1a8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  shared_ptr<chatra::Node> local_198;
  shared_ptr<chatra::Node> *local_180;
  shared_ptr<chatra::Node> local_178;
  shared_ptr<chatra::Node> local_168;
  shared_ptr<chatra::Node> local_158;
  shared_ptr<chatra::Node> local_148;
  shared_ptr<chatra::Node> local_138;
  Token **local_128;
  StatementPatternElement *local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  undefined7 *local_f8;
  long local_f0;
  undefined7 local_e8;
  undefined4 uStack_e1;
  undefined1 local_dd;
  pointer ppStack_d8;
  vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
  stack;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  char local_91;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  local_90;
  undefined1 auStack_88 [8];
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  itExp;
  _Alloc_hider local_78;
  size_type sStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  element_type *local_40;
  ParserContext *local_38;
  
  local_128 = it->_M_current;
  puVar15 = (uint *)it;
  local_120 = e;
  local_40 = (element_type *)this;
  local_38 = ct;
  if (OperatorParameter < e->type) goto LAB_0018ee68;
  uVar10 = (long)last._M_current - (long)local_128 >> 3;
  puVar15 = &switchD_0018d0ca::switchdataD_001d6db4;
  switch(e->type) {
  case Token:
    ppTVar11 = it->_M_current;
    puVar15 = &e->type;
    if ((*ppTVar11)->sid == e->token) {
LAB_0018d536:
      it->_M_current = ppTVar11 + 1;
      sVar23 = createNameNode(this,*ppTVar11);
      puVar15 = (uint *)sVar23.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
      goto LAB_0018eebb;
    }
    break;
  default:
    ppTVar11 = it->_M_current;
    if ((*ppTVar11)->type == Name) goto LAB_0018d536;
    break;
  case VariationName:
    if ((1 < uVar10) &&
       (((*it->_M_current)->sid == OpElementSelection &&
        (pTVar19 = it->_M_current[1], pTVar19->type == Name)))) {
LAB_0018d57e:
      sVar23 = createNameNode(this,pTVar19);
      puVar15 = (uint *)sVar23.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
      it->_M_current = it->_M_current + 2;
      this = (chatra *)local_40;
      goto LAB_0018eebb;
    }
    break;
  case LabelWithColon:
    if (1 < uVar10) {
      pTVar19 = *it->_M_current;
      if ((pTVar19->type == Name) && (it->_M_current[1]->sid == Colon)) goto LAB_0018d57e;
    }
    break;
  case StorageClassSpecifier:
    ppTVar11 = it->_M_current;
    if ((*ppTVar11)->sid == Static) {
      it->_M_current = ppTVar11 + 1;
      createNameNode(local_1b8,*ppTVar11);
      sVar23 = wrapByTuple((chatra *)local_40,(shared_ptr<chatra::Node> *)local_1b8,(Token *)0x0);
      puVar15 = (uint *)sVar23.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
LAB_0018e543:
      this = (chatra *)local_40;
      if (local_1b0 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0);
        this = (chatra *)local_40;
        puVar15 = &extraout_RDX_12->type;
      }
      goto LAB_0018eebb;
    }
    break;
  case Expression:
    local_90 = (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                )it->_M_current;
    if (local_90._M_current != last._M_current) {
      ppStack_d8 = (pointer)0x0;
      stack.
      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      stack.
      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      _Var14._M_current = local_90._M_current;
      do {
        ppTVar11 = _Var14._M_current;
        pTVar19 = *ppTVar11;
        if (pTVar19->type == OpenBracket) {
          std::
          vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
          ::emplace_back<chatra::StringId_const&,chatra::Token_const*const&>
                    ((vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                      *)&ppStack_d8,&pTVar19->sid,ppTVar11);
        }
        else if (pTVar19->type == CloseBracket) {
          SVar1 = pTVar19->sid;
          if (SVar1 == CloseBrace) {
            bVar9 = checkBracketPair(local_38,pTVar19,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)&ppStack_d8,OpenBrace);
          }
          else if (SVar1 == CloseBracket) {
            bVar9 = checkBracketPair(local_38,pTVar19,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)&ppStack_d8,OpenBracket);
          }
          else {
            if (SVar1 != CloseParenthesis) {
              local_58._M_allocated_capacity._0_6_ = 0x6e7265746e69;
              local_58._M_allocated_capacity._6_2_ = 0x6c61;
              local_58._8_6_ = 0x726f72726520;
              local_68._8_8_ = 0xe;
              local_58._M_local_buf[0xe] = '\0';
              auStack_88 = (undefined1  [8])0x0;
              itExp._M_current = (Token **)0x0;
              local_78._M_p = (pointer)0x0;
              local_68._M_allocated_capacity = (size_type)&local_58;
              ParserContext::errorAtToken
                        (local_38,Error,pTVar19,(string *)&local_68,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_88);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_88);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_allocated_capacity != &local_58) {
                operator_delete((void *)local_68._M_allocated_capacity);
              }
              puVar13 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar13 = &PTR__exception_002461d8;
              __cxa_throw(puVar13,&AbortCompilingException::typeinfo,std::exception::~exception);
            }
            bVar9 = checkBracketPair(local_38,pTVar19,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)&ppStack_d8,OpenParenthesis);
          }
          _Var14._M_current = local_90._M_current;
          if (bVar9 == false) goto LAB_0018e672;
        }
        _Var14._M_current = ppTVar11 + 1;
      } while (_Var14._M_current != last._M_current);
      if (ppStack_d8 !=
          stack.
          super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pTVar19 = *ppTVar11;
        local_e8 = 0x686374616d6e75;
        uStack_e1 = 0x27206465;
        local_f0 = 0xb;
        local_dd = 0;
        pbVar2 = (((local_38->sTable->
                   super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 idToStr).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar22 = *(long *)&pbVar2[stack.
                                  super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].first]._M_dataplus;
        local_f8 = &local_e8;
        local_b8 = local_a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,lVar22,
                   *(size_type *)
                    ((long)(pbVar2 + stack.
                                     super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-1].first) + 8) +
                   lVar22);
        uVar10 = 0xf;
        if (local_f8 != &local_e8) {
          uVar10 = CONCAT17((undefined1)uStack_e1,local_e8);
        }
        if (uVar10 < (ulong)(local_b0 + local_f0)) {
          uVar10 = 0xf;
          if (local_b8 != local_a8) {
            uVar10 = local_a8[0];
          }
          if (uVar10 < (ulong)(local_b0 + local_f0)) goto LAB_0018dada;
          plVar12 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_b8,0,(char *)0x0,(ulong)local_f8);
        }
        else {
LAB_0018dada:
          plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_b8);
        }
        auStack_88 = (undefined1  [8])&stack0xffffffffffffff88;
        pbVar2 = (pointer)(plVar12 + 2);
        if ((pointer)*plVar12 == pbVar2) {
          local_78._M_p = (pbVar2->_M_dataplus)._M_p;
          sStack_70 = plVar12[3];
        }
        else {
          local_78._M_p = (pbVar2->_M_dataplus)._M_p;
          auStack_88 = (undefined1  [8])*plVar12;
        }
        itExp._M_current = (Token **)plVar12[1];
        *plVar12 = (long)pbVar2;
        plVar12[1] = 0;
        *(undefined1 *)&(pbVar2->_M_dataplus)._M_p = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append(auStack_88);
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 == paVar16) {
          uVar5 = puVar13[3];
          local_58._M_allocated_capacity._0_6_ = (undefined6)paVar16->_M_allocated_capacity;
          local_58._M_allocated_capacity._6_2_ =
               (undefined2)(paVar16->_M_allocated_capacity >> 0x30);
          local_58._8_6_ = (undefined6)uVar5;
          local_58._M_local_buf[0xe] = (char)((ulong)uVar5 >> 0x30);
          local_58._M_local_buf[0xf] = (char)((ulong)uVar5 >> 0x38);
          local_68._M_allocated_capacity = (size_type)&local_58;
        }
        else {
          local_58._M_allocated_capacity._0_6_ = (undefined6)paVar16->_M_allocated_capacity;
          local_58._M_allocated_capacity._6_2_ =
               (undefined2)(paVar16->_M_allocated_capacity >> 0x30);
          local_68._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar13;
        }
        local_68._8_8_ = puVar13[1];
        *puVar13 = paVar16;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ParserContext::errorAtNextToken(local_38,Error,pTVar19,(string *)&local_68,&local_118);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_allocated_capacity != &local_58) {
          operator_delete((void *)local_68._M_allocated_capacity);
        }
        if (auStack_88 != (undefined1  [8])&stack0xffffffffffffff88) {
          operator_delete((void *)auStack_88);
        }
        if (local_b8 != local_a8) {
          operator_delete(local_b8);
        }
        this = (chatra *)local_40;
        _Var14._M_current = local_90._M_current;
        if (local_f8 != &local_e8) {
          operator_delete(local_f8);
          this = (chatra *)local_40;
          _Var14._M_current = local_90._M_current;
        }
      }
LAB_0018e672:
      local_90._M_current = _Var14._M_current;
      if (ppStack_d8 != (pointer)0x0) {
        operator_delete(ppStack_d8);
      }
    }
    _Var14._M_current = local_90._M_current;
    puVar15 = (uint *)it->_M_current;
    if (local_90._M_current == (Token **)puVar15) {
      *(undefined8 *)this = 0;
      (((element_type *)this)->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
    }
    else {
      sVar23 = parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                         (this,local_38,
                          (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                           )puVar15,local_90);
      puVar15 = (uint *)sVar23.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
      it->_M_current = (Token **)_Var14;
    }
    lVar22 = *(long *)this;
    this = (chatra *)local_40;
    if (lVar22 != 0) goto LAB_0018eebb;
    peVar20 = (local_40->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    goto LAB_0018e6c0;
  case TupleExpression:
    local_90 = (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                )it->_M_current;
    if (local_90._M_current != last._M_current) {
      ppStack_d8 = (pointer)0x0;
      stack.
      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      stack.
      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      _Var14._M_current = local_90._M_current;
      do {
        ppTVar11 = _Var14._M_current;
        pTVar19 = *ppTVar11;
        if (pTVar19->type == OpenBracket) {
          std::
          vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
          ::emplace_back<chatra::StringId_const&,chatra::Token_const*const&>
                    ((vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                      *)&ppStack_d8,&pTVar19->sid,ppTVar11);
        }
        else if (pTVar19->type == CloseBracket) {
          SVar1 = pTVar19->sid;
          if (SVar1 == CloseBrace) {
            bVar9 = checkBracketPair(local_38,pTVar19,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)&ppStack_d8,OpenBrace);
          }
          else if (SVar1 == CloseBracket) {
            bVar9 = checkBracketPair(local_38,pTVar19,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)&ppStack_d8,OpenBracket);
          }
          else {
            if (SVar1 != CloseParenthesis) {
              local_58._M_allocated_capacity._0_6_ = 0x6e7265746e69;
              local_58._M_allocated_capacity._6_2_ = 0x6c61;
              local_58._8_6_ = 0x726f72726520;
              local_68._8_8_ = 0xe;
              local_58._M_local_buf[0xe] = '\0';
              auStack_88 = (undefined1  [8])0x0;
              itExp._M_current = (Token **)0x0;
              local_78._M_p = (pointer)0x0;
              local_68._M_allocated_capacity = (size_type)&local_58;
              ParserContext::errorAtToken
                        (local_38,Error,pTVar19,(string *)&local_68,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_88);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_88);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_allocated_capacity != &local_58) {
                operator_delete((void *)local_68._M_allocated_capacity);
              }
              puVar13 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar13 = &PTR__exception_002461d8;
              __cxa_throw(puVar13,&AbortCompilingException::typeinfo,std::exception::~exception);
            }
            bVar9 = checkBracketPair(local_38,pTVar19,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)&ppStack_d8,OpenParenthesis);
          }
          _Var14._M_current = local_90._M_current;
          if (bVar9 == false) goto LAB_0018e479;
        }
        _Var14._M_current = ppTVar11 + 1;
      } while (_Var14._M_current != last._M_current);
      if (ppStack_d8 !=
          stack.
          super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pTVar19 = *ppTVar11;
        local_e8 = 0x686374616d6e75;
        uStack_e1 = 0x27206465;
        local_f0 = 0xb;
        local_dd = 0;
        pbVar2 = (((local_38->sTable->
                   super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 idToStr).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar22 = *(long *)&pbVar2[stack.
                                  super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].first]._M_dataplus;
        local_f8 = &local_e8;
        local_b8 = local_a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,lVar22,
                   *(size_type *)
                    ((long)(pbVar2 + stack.
                                     super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-1].first) + 8) +
                   lVar22);
        uVar10 = 0xf;
        if (local_f8 != &local_e8) {
          uVar10 = CONCAT17((undefined1)uStack_e1,local_e8);
        }
        if (uVar10 < (ulong)(local_b0 + local_f0)) {
          uVar10 = 0xf;
          if (local_b8 != local_a8) {
            uVar10 = local_a8[0];
          }
          if (uVar10 < (ulong)(local_b0 + local_f0)) goto LAB_0018d714;
          plVar12 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_b8,0,(char *)0x0,(ulong)local_f8);
        }
        else {
LAB_0018d714:
          plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_b8);
        }
        auStack_88 = (undefined1  [8])&stack0xffffffffffffff88;
        pbVar2 = (pointer)(plVar12 + 2);
        if ((pointer)*plVar12 == pbVar2) {
          local_78._M_p = (pbVar2->_M_dataplus)._M_p;
          sStack_70 = plVar12[3];
        }
        else {
          local_78._M_p = (pbVar2->_M_dataplus)._M_p;
          auStack_88 = (undefined1  [8])*plVar12;
        }
        itExp._M_current = (Token **)plVar12[1];
        *plVar12 = (long)pbVar2;
        plVar12[1] = 0;
        *(undefined1 *)&(pbVar2->_M_dataplus)._M_p = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append(auStack_88);
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 == paVar16) {
          uVar5 = puVar13[3];
          local_58._M_allocated_capacity._0_6_ = (undefined6)paVar16->_M_allocated_capacity;
          local_58._M_allocated_capacity._6_2_ =
               (undefined2)(paVar16->_M_allocated_capacity >> 0x30);
          local_58._8_6_ = (undefined6)uVar5;
          local_58._M_local_buf[0xe] = (char)((ulong)uVar5 >> 0x30);
          local_58._M_local_buf[0xf] = (char)((ulong)uVar5 >> 0x38);
          local_68._M_allocated_capacity = (size_type)&local_58;
        }
        else {
          local_58._M_allocated_capacity._0_6_ = (undefined6)paVar16->_M_allocated_capacity;
          local_58._M_allocated_capacity._6_2_ =
               (undefined2)(paVar16->_M_allocated_capacity >> 0x30);
          local_68._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar13;
        }
        local_68._8_8_ = puVar13[1];
        *puVar13 = paVar16;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ParserContext::errorAtNextToken(local_38,Error,pTVar19,(string *)&local_68,&local_118);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_allocated_capacity != &local_58) {
          operator_delete((void *)local_68._M_allocated_capacity);
        }
        if (auStack_88 != (undefined1  [8])&stack0xffffffffffffff88) {
          operator_delete((void *)auStack_88);
        }
        if (local_b8 != local_a8) {
          operator_delete(local_b8);
        }
        this = (chatra *)local_40;
        _Var14._M_current = local_90._M_current;
        if (local_f8 != &local_e8) {
          operator_delete(local_f8);
          this = (chatra *)local_40;
          _Var14._M_current = local_90._M_current;
        }
      }
LAB_0018e479:
      local_90._M_current = _Var14._M_current;
      if (ppStack_d8 != (pointer)0x0) {
        operator_delete(ppStack_d8);
      }
    }
    _Var14._M_current = local_90._M_current;
    puVar15 = (uint *)it->_M_current;
    if (local_90._M_current == (Token **)puVar15) {
      *(undefined8 *)this = 0;
      (((element_type *)this)->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
    }
    else {
      sVar23 = parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                         (this,local_38,
                          (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                           )puVar15,local_90);
      puVar15 = (uint *)sVar23.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
      it->_M_current = (Token **)_Var14;
    }
    peVar3 = local_40;
    local_178.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)this;
    if (local_178.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      this = (chatra *)local_40;
      if ((local_178.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->op !=
          Pair) goto LAB_0018eebb;
      local_178.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (local_40->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((element_type *)
          local_178.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((element_type *)
                    local_178.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->fileName)._M_dataplus._M_p =
               *(int *)&(((element_type *)
                         local_178.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->fileName)._M_dataplus._M_p + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((element_type *)
                    local_178.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->fileName)._M_dataplus._M_p =
               *(int *)&(((element_type *)
                         local_178.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->fileName)._M_dataplus._M_p + 1;
        }
      }
      sVar23 = wrapByTuple((chatra *)local_68._M_local_buf,&local_178,(Token *)0x0);
      uVar7 = local_68._8_8_;
      uVar5 = local_68._M_allocated_capacity;
      puVar15 = (uint *)sVar23.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
      local_68._M_allocated_capacity = 0;
      local_68._8_8_ = (element_type *)0x0;
      peVar20 = (peVar3->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      *(undefined8 *)peVar3 = uVar5;
      (peVar3->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar7;
      if (peVar20 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar20);
        puVar15 = &extraout_RDX_10->type;
      }
      local_1b0 = (element_type *)
                  local_178.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
      if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
        puVar15 = &extraout_RDX_11->type;
        local_1b0 = (element_type *)
                    local_178.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      }
      goto LAB_0018e543;
    }
    goto LAB_0018e4f3;
  case ParameterList:
    ppTVar11 = it->_M_current;
    if ((*ppTVar11)->sid == OpenParenthesis) {
      local_90._M_current = ppTVar11 + 1;
      if (local_90._M_current != last._M_current) {
        ppStack_d8 = (pointer)0x0;
        stack.
        super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        stack.
        super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        lVar22 = 8;
        do {
          puVar15 = (uint *)((long)ppTVar11 + lVar22);
          if ((ppStack_d8 ==
               stack.
               super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start) &&
             (*(StringId *)((long)*(Token ***)puVar15 + 0x2c) == CloseParenthesis)) break;
          _Var14._M_current = *(Token ***)puVar15;
          if (*(TokenType *)(_Var14._M_current + 5) == CloseBracket) {
            SVar1 = *(StringId *)((long)_Var14._M_current + 0x2c);
            if (SVar1 == CloseBrace) {
              bVar9 = checkBracketPair(local_38,(Token *)_Var14._M_current,
                                       (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                        *)&ppStack_d8,OpenBrace);
              puVar15 = &extraout_RDX_02->type;
            }
            else if (SVar1 == CloseBracket) {
              bVar9 = checkBracketPair(local_38,(Token *)_Var14._M_current,
                                       (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                        *)&ppStack_d8,OpenBracket);
              puVar15 = &extraout_RDX_01->type;
            }
            else {
              if (SVar1 != CloseParenthesis) {
                local_58._M_allocated_capacity._0_6_ = 0x6e7265746e69;
                local_58._M_allocated_capacity._6_2_ = 0x6c61;
                local_58._8_6_ = 0x726f72726520;
                local_68._8_8_ = 0xe;
                local_58._M_local_buf[0xe] = '\0';
                auStack_88 = (undefined1  [8])0x0;
                itExp._M_current = (Token **)0x0;
                local_78._M_p = (pointer)0x0;
                local_68._M_allocated_capacity = (size_type)&local_58;
                ParserContext::errorAtToken
                          (local_38,Error,(Token *)_Var14._M_current,(string *)&local_68,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_88);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_88);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_allocated_capacity != &local_58) {
                  operator_delete((void *)local_68._M_allocated_capacity);
                }
                puVar13 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar13 = &PTR__exception_002461d8;
                __cxa_throw(puVar13,&AbortCompilingException::typeinfo,std::exception::~exception);
              }
              bVar9 = checkBracketPair(local_38,(Token *)_Var14._M_current,
                                       (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                        *)&ppStack_d8,OpenParenthesis);
              puVar15 = &extraout_RDX_00->type;
            }
            _Var14._M_current = local_90._M_current;
            if (bVar9 == false) goto LAB_0018ed7c;
          }
          else if (*(TokenType *)(_Var14._M_current + 5) == OpenBracket) {
            std::
            vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
            ::emplace_back<chatra::StringId_const&,chatra::Token_const*const&>
                      ((vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                        *)&ppStack_d8,(StringId *)((long)_Var14._M_current + 0x2c),(Token **)puVar15
                      );
            puVar15 = &extraout_RDX->type;
          }
          lVar6 = lVar22 + 8;
          lVar22 = lVar22 + 8;
        } while ((Token **)((long)ppTVar11 + lVar6) != last._M_current);
        _Var14._M_current = (Token **)((long)ppTVar11 + lVar22);
        if (ppStack_d8 !=
            stack.
            super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          _Var14._M_current = (Token **)((long)ppTVar11 + lVar22) + -1;
          if (lVar22 == 8) {
            _Var14._M_current = local_90._M_current;
          }
          pTVar19 = *_Var14._M_current;
          local_e8 = 0x686374616d6e75;
          uStack_e1 = 0x27206465;
          local_f0 = 0xb;
          local_dd = 0;
          pbVar2 = (((local_38->sTable->
                     super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   idToStr).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar22 = *(long *)&pbVar2[stack.
                                    super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].first]._M_dataplus
          ;
          local_f8 = &local_e8;
          local_b8 = local_a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,lVar22,
                     *(size_type *)
                      ((long)(pbVar2 + stack.
                                       super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[-1].first) + 8) +
                     lVar22);
          uVar10 = 0xf;
          if (local_f8 != &local_e8) {
            uVar10 = CONCAT17((undefined1)uStack_e1,local_e8);
          }
          if (uVar10 < (ulong)(local_b0 + local_f0)) {
            uVar10 = 0xf;
            if (local_b8 != local_a8) {
              uVar10 = local_a8[0];
            }
            if (uVar10 < (ulong)(local_b0 + local_f0)) goto LAB_0018de5b;
            plVar12 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_b8,0,(char *)0x0,(ulong)local_f8);
          }
          else {
LAB_0018de5b:
            plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_b8);
          }
          auStack_88 = (undefined1  [8])&stack0xffffffffffffff88;
          pbVar2 = (pointer)(plVar12 + 2);
          if ((pointer)*plVar12 == pbVar2) {
            local_78._M_p = (pbVar2->_M_dataplus)._M_p;
            sStack_70 = plVar12[3];
          }
          else {
            local_78._M_p = (pbVar2->_M_dataplus)._M_p;
            auStack_88 = (undefined1  [8])*plVar12;
          }
          itExp._M_current = (Token **)plVar12[1];
          *plVar12 = (long)pbVar2;
          plVar12[1] = 0;
          *(undefined1 *)&(pbVar2->_M_dataplus)._M_p = 0;
          puVar13 = (undefined8 *)std::__cxx11::string::append(auStack_88);
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 == paVar16) {
            uVar5 = puVar13[3];
            local_58._M_allocated_capacity._0_6_ = (undefined6)paVar16->_M_allocated_capacity;
            local_58._M_allocated_capacity._6_2_ =
                 (undefined2)(paVar16->_M_allocated_capacity >> 0x30);
            local_58._8_6_ = (undefined6)uVar5;
            local_58._M_local_buf[0xe] = (char)((ulong)uVar5 >> 0x30);
            local_58._M_local_buf[0xf] = (char)((ulong)uVar5 >> 0x38);
            local_68._M_allocated_capacity = (size_type)&local_58;
          }
          else {
            local_58._M_allocated_capacity._0_6_ = (undefined6)paVar16->_M_allocated_capacity;
            local_58._M_allocated_capacity._6_2_ =
                 (undefined2)(paVar16->_M_allocated_capacity >> 0x30);
            local_68._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar13;
          }
          local_68._8_8_ = puVar13[1];
          *puVar13 = paVar16;
          puVar13[1] = 0;
          *(undefined1 *)(puVar13 + 2) = 0;
          local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ParserContext::errorAtNextToken(local_38,Error,pTVar19,(string *)&local_68,&local_118);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_118);
          puVar15 = &extraout_RDX_24->type;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_allocated_capacity != &local_58) {
            operator_delete((void *)local_68._M_allocated_capacity);
            puVar15 = &extraout_RDX_25->type;
          }
          if (auStack_88 != (undefined1  [8])&stack0xffffffffffffff88) {
            operator_delete((void *)auStack_88);
            puVar15 = &extraout_RDX_26->type;
          }
          if (local_b8 != local_a8) {
            operator_delete(local_b8);
            puVar15 = &extraout_RDX_27->type;
          }
          _Var14._M_current = local_90._M_current;
          if (local_f8 != &local_e8) {
            operator_delete(local_f8);
            puVar15 = &extraout_RDX_28->type;
            _Var14._M_current = local_90._M_current;
          }
        }
LAB_0018ed7c:
        local_90._M_current = _Var14._M_current;
        if (ppStack_d8 != (pointer)0x0) {
          operator_delete(ppStack_d8);
          puVar15 = &extraout_RDX_29->type;
        }
      }
      _Var14._M_current = local_90._M_current;
      iVar18 = 2;
      if ((local_90._M_current != last._M_current) &&
         ((*local_90._M_current)->sid == CloseParenthesis)) {
        if (local_90._M_current == it->_M_current + 1) {
          ppTVar11 = it->_M_current;
          it->_M_current = ppTVar11 + 2;
          local_198.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_198.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          sVar23 = wrapByTuple((chatra *)local_40,&local_198,*ppTVar11);
          puVar15 = (uint *)sVar23.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
          iVar18 = 1;
          this_00._M_pi =
               local_198.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
LAB_0018ee59:
          if ((element_type *)this_00._M_pi != (element_type *)0x0) goto LAB_0018ee5e;
        }
        else {
          parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                    (local_1a8,local_38,
                     (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                      )(it->_M_current + 1),local_90);
          wrapByTuple((chatra *)local_40,(shared_ptr<chatra::Node> *)local_1a8,(Token *)0x0);
          if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
          }
          bVar9 = checkAsParameterList(local_38,(shared_ptr<chatra::Node> *)local_40);
          iVar18 = 2;
          if (bVar9) {
            it->_M_current = _Var14._M_current + 1;
            iVar18 = 1;
          }
          this_00._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (local_40->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          puVar15 = &extraout_RDX_30->type;
          if (!bVar9 && (element_type *)this_00._M_pi != (element_type *)0x0) {
LAB_0018ee5e:
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
            puVar15 = &extraout_RDX_31->type;
          }
        }
      }
LAB_0018ee63:
      this = (chatra *)local_40;
      if (iVar18 != 2) goto LAB_0018eebb;
    }
    break;
  case Qualifiers:
    if ((1 < uVar10) && ((*it->_M_current)->sid == As)) {
      auStack_88 = (undefined1  [8])(it->_M_current + 1);
      sVar23 = extractExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>,chatra::extractStatementPiece<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>(chatra::ParserContext&,__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>&,__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>,chatra::StatementPatternElement_const&)::_lambda(chatra::Token_const&)_4_>
                         (this,ct,auStack_88,last._M_current);
      puVar15 = (uint *)sVar23.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
      peVar3 = *(element_type **)this;
      bVar9 = true;
      if (peVar3 == (element_type *)0x0) {
LAB_0018ea81:
        bVar8 = false;
      }
      else {
        local_168.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
        if (local_168.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_168.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_168.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_168.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_168.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
          }
        }
        local_168.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
        wrapByTuple((chatra *)local_68._M_local_buf,&local_168,(Token *)0x0);
        uVar7 = local_68._8_8_;
        uVar5 = local_68._M_allocated_capacity;
        local_68._M_allocated_capacity = 0;
        local_68._8_8_ = (element_type *)0x0;
        peVar20 = (local_40->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        *(undefined8 *)local_40 = uVar5;
        (local_40->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)uVar7;
        if (peVar20 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar20);
        }
        if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
        }
        if (local_168.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_168.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        bVar8 = checkAsQualifiers(local_38,(shared_ptr<chatra::Node> *)local_40);
        puVar15 = &extraout_RDX_21->type;
        if (!bVar8) goto LAB_0018ea81;
        it->_M_current = (Token **)auStack_88;
        bVar8 = true;
        bVar9 = false;
      }
      if ((!bVar8) &&
         (peVar20 = (local_40->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr, peVar20 != (element_type *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar20);
        puVar15 = &extraout_RDX_22->type;
      }
      this = (chatra *)local_40;
      if (!bVar9) goto LAB_0018eebb;
    }
    break;
  case ClassList:
    local_90 = (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                )it->_M_current;
    if (local_90._M_current != last._M_current) {
      ppStack_d8 = (pointer)0x0;
      stack.
      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      stack.
      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      _Var14._M_current = local_90._M_current;
      do {
        ppTVar11 = _Var14._M_current;
        pTVar19 = *ppTVar11;
        if (pTVar19->type == OpenBracket) {
          std::
          vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
          ::emplace_back<chatra::StringId_const&,chatra::Token_const*const&>
                    ((vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                      *)&ppStack_d8,&pTVar19->sid,ppTVar11);
        }
        else if (pTVar19->type == CloseBracket) {
          SVar1 = pTVar19->sid;
          if (SVar1 == CloseBrace) {
            bVar9 = checkBracketPair(local_38,pTVar19,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)&ppStack_d8,OpenBrace);
          }
          else if (SVar1 == CloseBracket) {
            bVar9 = checkBracketPair(local_38,pTVar19,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)&ppStack_d8,OpenBracket);
          }
          else {
            if (SVar1 != CloseParenthesis) {
              local_58._M_allocated_capacity._0_6_ = 0x6e7265746e69;
              local_58._M_allocated_capacity._6_2_ = 0x6c61;
              local_58._8_6_ = 0x726f72726520;
              local_68._8_8_ = 0xe;
              local_58._M_local_buf[0xe] = '\0';
              auStack_88 = (undefined1  [8])0x0;
              itExp._M_current = (Token **)0x0;
              local_78._M_p = (pointer)0x0;
              local_68._M_allocated_capacity = (size_type)&local_58;
              ParserContext::errorAtToken
                        (local_38,Error,pTVar19,(string *)&local_68,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_88);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_88);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_allocated_capacity != &local_58) {
                operator_delete((void *)local_68._M_allocated_capacity);
              }
              puVar13 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar13 = &PTR__exception_002461d8;
              __cxa_throw(puVar13,&AbortCompilingException::typeinfo,std::exception::~exception);
            }
            bVar9 = checkBracketPair(local_38,pTVar19,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)&ppStack_d8,OpenParenthesis);
          }
          _Var14._M_current = local_90._M_current;
          if (bVar9 == false) goto LAB_0018e7ef;
        }
        _Var14._M_current = ppTVar11 + 1;
      } while (_Var14._M_current != last._M_current);
      if (ppStack_d8 !=
          stack.
          super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pTVar19 = *ppTVar11;
        local_e8 = 0x686374616d6e75;
        uStack_e1 = 0x27206465;
        local_f0 = 0xb;
        local_dd = 0;
        pbVar2 = (((local_38->sTable->
                   super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 idToStr).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar22 = *(long *)&pbVar2[stack.
                                  super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].first]._M_dataplus;
        local_f8 = &local_e8;
        local_b8 = local_a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,lVar22,
                   *(size_type *)
                    ((long)(pbVar2 + stack.
                                     super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-1].first) + 8) +
                   lVar22);
        uVar10 = 0xf;
        if (local_f8 != &local_e8) {
          uVar10 = CONCAT17((undefined1)uStack_e1,local_e8);
        }
        if (uVar10 < (ulong)(local_b0 + local_f0)) {
          uVar10 = 0xf;
          if (local_b8 != local_a8) {
            uVar10 = local_a8[0];
          }
          if (uVar10 < (ulong)(local_b0 + local_f0)) goto LAB_0018dc75;
          plVar12 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_b8,0,(char *)0x0,(ulong)local_f8);
        }
        else {
LAB_0018dc75:
          plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_b8);
        }
        auStack_88 = (undefined1  [8])&stack0xffffffffffffff88;
        pbVar2 = (pointer)(plVar12 + 2);
        if ((pointer)*plVar12 == pbVar2) {
          local_78._M_p = (pbVar2->_M_dataplus)._M_p;
          sStack_70 = plVar12[3];
        }
        else {
          local_78._M_p = (pbVar2->_M_dataplus)._M_p;
          auStack_88 = (undefined1  [8])*plVar12;
        }
        itExp._M_current = (Token **)plVar12[1];
        *plVar12 = (long)pbVar2;
        plVar12[1] = 0;
        *(undefined1 *)&(pbVar2->_M_dataplus)._M_p = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append(auStack_88);
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 == paVar16) {
          uVar5 = puVar13[3];
          local_58._M_allocated_capacity._0_6_ = (undefined6)paVar16->_M_allocated_capacity;
          local_58._M_allocated_capacity._6_2_ =
               (undefined2)(paVar16->_M_allocated_capacity >> 0x30);
          local_58._8_6_ = (undefined6)uVar5;
          local_58._M_local_buf[0xe] = (char)((ulong)uVar5 >> 0x30);
          local_58._M_local_buf[0xf] = (char)((ulong)uVar5 >> 0x38);
          local_68._M_allocated_capacity = (size_type)&local_58;
        }
        else {
          local_58._M_allocated_capacity._0_6_ = (undefined6)paVar16->_M_allocated_capacity;
          local_58._M_allocated_capacity._6_2_ =
               (undefined2)(paVar16->_M_allocated_capacity >> 0x30);
          local_68._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar13;
        }
        local_68._8_8_ = puVar13[1];
        *puVar13 = paVar16;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ParserContext::errorAtNextToken(local_38,Error,pTVar19,(string *)&local_68,&local_118);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_allocated_capacity != &local_58) {
          operator_delete((void *)local_68._M_allocated_capacity);
        }
        if (auStack_88 != (undefined1  [8])&stack0xffffffffffffff88) {
          operator_delete((void *)auStack_88);
        }
        if (local_b8 != local_a8) {
          operator_delete(local_b8);
        }
        this = (chatra *)local_40;
        _Var14._M_current = local_90._M_current;
        if (local_f8 != &local_e8) {
          operator_delete(local_f8);
          this = (chatra *)local_40;
          _Var14._M_current = local_90._M_current;
        }
      }
LAB_0018e7ef:
      local_90._M_current = _Var14._M_current;
      if (ppStack_d8 != (pointer)0x0) {
        operator_delete(ppStack_d8);
      }
    }
    _Var14._M_current = local_90._M_current;
    puVar15 = (uint *)it->_M_current;
    if (local_90._M_current == (Token **)puVar15) {
      *(undefined8 *)this = 0;
      (((element_type *)this)->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
    }
    else {
      sVar23 = parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                         (this,local_38,
                          (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                           )puVar15,local_90);
      puVar15 = (uint *)sVar23.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
      it->_M_current = (Token **)_Var14;
    }
    peVar3 = *(element_type **)this;
    if (peVar3 == (element_type *)0x0) {
      bVar17 = 1;
      _Var14._M_current = (Token **)0x0;
    }
    else {
      local_158.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (((element_type *)this)->line).
           super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((element_type *)
          local_158.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((element_type *)
                    local_158.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->fileName)._M_dataplus._M_p =
               *(int *)&(((element_type *)
                         local_158.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->fileName)._M_dataplus._M_p + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((element_type *)
                    local_158.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->fileName)._M_dataplus._M_p =
               *(int *)&(((element_type *)
                         local_158.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->fileName)._M_dataplus._M_p + 1;
        }
      }
      local_158.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
      sVar23 = wrapByTuple((chatra *)local_68._M_local_buf,&local_158,(Token *)0x0);
      uVar7 = local_68._8_8_;
      uVar5 = local_68._M_allocated_capacity;
      puVar15 = (uint *)sVar23.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
      local_68._M_allocated_capacity = 0;
      local_68._8_8_ = (element_type *)0x0;
      *(undefined8 *)local_40 = uVar5;
      peVar20 = (local_40->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      (local_40->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar7;
      if (peVar20 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar20);
        puVar15 = &extraout_RDX_14->type;
      }
      if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
        puVar15 = &extraout_RDX_15->type;
      }
      if ((element_type *)
          local_158.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_158.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        puVar15 = &extraout_RDX_16->type;
      }
      node = (shared_ptr<chatra::Node> *)
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(uVar5 + 0x60))->_M_allocated_capacity;
      psVar21 = *(shared_ptr<chatra::Node> **)(uVar5 + 0x68);
      _Var14._M_current = (Token **)(ulong)(node == psVar21);
      if (node != psVar21) {
        _Var14._M_current = (Token **)0x0;
        local_180 = psVar21;
        do {
          bVar9 = matchesAsNameChain(node);
          puVar15 = &extraout_RDX_17->type;
          if (!bVar9) {
            peVar3 = (node->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            pTVar19 = *(peVar3->tokens).
                       super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pTVar4 = (peVar3->tokens).
                     super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1];
            local_68._M_allocated_capacity = (size_type)&local_58;
            auStack_88 = (undefined1  [8])0x14;
            local_91 = bVar9;
            local_90._M_current = _Var14._M_current;
            local_68._M_allocated_capacity =
                 std::__cxx11::string::_M_create(&local_68._M_allocated_capacity,(ulong)auStack_88);
            local_58._M_allocated_capacity._0_6_ = auStack_88._0_6_;
            local_58._M_allocated_capacity._6_2_ = auStack_88._6_2_;
            *(undefined8 *)local_68._M_allocated_capacity = 0x6465746365707865;
            *(char *)(local_68._M_allocated_capacity + 8) = ' ';
            *(char *)(local_68._M_allocated_capacity + 9) = 'c';
            *(char *)(local_68._M_allocated_capacity + 10) = 'l';
            *(char *)(local_68._M_allocated_capacity + 0xb) = 'a';
            *(char *)(local_68._M_allocated_capacity + 0xc) = 's';
            *(char *)(local_68._M_allocated_capacity + 0xd) = 's';
            *(char *)(local_68._M_allocated_capacity + 0xe) = ' ';
            *(char *)(local_68._M_allocated_capacity + 0xf) = 'n';
            *(char *)(local_68._M_allocated_capacity + 0x10) = 'a';
            *(char *)(local_68._M_allocated_capacity + 0x11) = 'm';
            *(char *)(local_68._M_allocated_capacity + 0x12) = 'e';
            *(char *)(local_68._M_allocated_capacity + 0x13) = 's';
            local_68._8_8_ = auStack_88;
            *(char *)(local_68._M_allocated_capacity + (long)auStack_88) = '\0';
            auStack_88 = (undefined1  [8])0x0;
            itExp._M_current = (Token **)0x0;
            local_78._M_p = (pointer)0x0;
            ParserContext::errorAtToken
                      (local_38,Error,pTVar19,pTVar4,(string *)&local_68,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)auStack_88);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_88);
            _Var14._M_current = local_90._M_current;
            psVar21 = local_180;
            puVar15 = &extraout_RDX_18->type;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_allocated_capacity != &local_58) {
              operator_delete((void *)local_68._M_allocated_capacity);
              puVar15 = &extraout_RDX_19->type;
            }
            if (local_91 == '\0') break;
          }
          node = node + 1;
          _Var14._M_current =
               (Token **)CONCAT71((int7)((ulong)_Var14._M_current >> 8),node == psVar21);
        } while (node != psVar21);
      }
      bVar17 = (byte)_Var14._M_current ^ 1;
    }
    if (((ulong)_Var14._M_current & 1) == 0) {
LAB_0018e9d5:
      peVar20 = (local_40->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      if (peVar20 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar20);
        puVar15 = &extraout_RDX_20->type;
      }
    }
    goto LAB_0018e9e7;
  case VarDefinitions:
    ppTVar11 = it->_M_current;
    local_90._M_current = ppTVar11;
    if (ppTVar11 != last._M_current) {
      ppStack_d8 = (pointer)0x0;
      stack.
      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      stack.
      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      do {
        if ((ppStack_d8 ==
             stack.
             super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start) && ((*ppTVar11)->sid == As)) break;
        pTVar19 = *ppTVar11;
        if (pTVar19->type == CloseBracket) {
          SVar1 = pTVar19->sid;
          if (SVar1 == CloseBrace) {
            bVar9 = checkBracketPair(local_38,pTVar19,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)&ppStack_d8,OpenBrace);
          }
          else if (SVar1 == CloseBracket) {
            bVar9 = checkBracketPair(local_38,pTVar19,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)&ppStack_d8,OpenBracket);
          }
          else {
            if (SVar1 != CloseParenthesis) {
              local_58._M_allocated_capacity._0_6_ = 0x6e7265746e69;
              local_58._M_allocated_capacity._6_2_ = 0x6c61;
              local_58._8_6_ = 0x726f72726520;
              local_68._8_8_ = 0xe;
              local_58._M_local_buf[0xe] = '\0';
              auStack_88 = (undefined1  [8])0x0;
              itExp._M_current = (Token **)0x0;
              local_78._M_p = (pointer)0x0;
              local_68._M_allocated_capacity = (size_type)&local_58;
              ParserContext::errorAtToken
                        (local_38,Error,pTVar19,(string *)&local_68,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_88);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_88);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_allocated_capacity != &local_58) {
                operator_delete((void *)local_68._M_allocated_capacity);
              }
              puVar13 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar13 = &PTR__exception_002461d8;
              __cxa_throw(puVar13,&AbortCompilingException::typeinfo,std::exception::~exception);
            }
            bVar9 = checkBracketPair(local_38,pTVar19,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)&ppStack_d8,OpenParenthesis);
          }
          _Var14._M_current = local_90._M_current;
          if (bVar9 == false) goto LAB_0018dff8;
        }
        else if (pTVar19->type == OpenBracket) {
          std::
          vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
          ::emplace_back<chatra::StringId_const&,chatra::Token_const*const&>
                    ((vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                      *)&ppStack_d8,&pTVar19->sid,ppTVar11);
        }
        ppTVar11 = ppTVar11 + 1;
      } while (ppTVar11 != last._M_current);
      _Var14._M_current = ppTVar11;
      if (ppStack_d8 !=
          stack.
          super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        _Var14._M_current = ppTVar11 + -1;
        if (ppTVar11 == local_90._M_current) {
          _Var14._M_current = local_90._M_current;
        }
        pTVar19 = *_Var14._M_current;
        local_e8 = 0x686374616d6e75;
        uStack_e1 = 0x27206465;
        local_f0 = 0xb;
        local_dd = 0;
        pbVar2 = (((local_38->sTable->
                   super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 idToStr).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar22 = *(long *)&pbVar2[stack.
                                  super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].first]._M_dataplus;
        local_f8 = &local_e8;
        local_b8 = local_a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,lVar22,
                   *(size_type *)
                    ((long)(pbVar2 + stack.
                                     super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-1].first) + 8) +
                   lVar22);
        uVar10 = 0xf;
        if (local_f8 != &local_e8) {
          uVar10 = CONCAT17((undefined1)uStack_e1,local_e8);
        }
        if (uVar10 < (ulong)(local_b0 + local_f0)) {
          uVar10 = 0xf;
          if (local_b8 != local_a8) {
            uVar10 = local_a8[0];
          }
          if (uVar10 < (ulong)(local_b0 + local_f0)) goto LAB_0018d293;
          plVar12 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_b8,0,(char *)0x0,(ulong)local_f8);
        }
        else {
LAB_0018d293:
          plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_b8);
        }
        auStack_88 = (undefined1  [8])&stack0xffffffffffffff88;
        pbVar2 = (pointer)(plVar12 + 2);
        if ((pointer)*plVar12 == pbVar2) {
          local_78._M_p = (pbVar2->_M_dataplus)._M_p;
          sStack_70 = plVar12[3];
        }
        else {
          local_78._M_p = (pbVar2->_M_dataplus)._M_p;
          auStack_88 = (undefined1  [8])*plVar12;
        }
        itExp._M_current = (Token **)plVar12[1];
        *plVar12 = (long)pbVar2;
        plVar12[1] = 0;
        *(undefined1 *)&(pbVar2->_M_dataplus)._M_p = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append(auStack_88);
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 == paVar16) {
          uVar5 = puVar13[3];
          local_58._M_allocated_capacity._0_6_ = (undefined6)paVar16->_M_allocated_capacity;
          local_58._M_allocated_capacity._6_2_ =
               (undefined2)(paVar16->_M_allocated_capacity >> 0x30);
          local_58._8_6_ = (undefined6)uVar5;
          local_58._M_local_buf[0xe] = (char)((ulong)uVar5 >> 0x30);
          local_58._M_local_buf[0xf] = (char)((ulong)uVar5 >> 0x38);
          local_68._M_allocated_capacity = (size_type)&local_58;
        }
        else {
          local_58._M_allocated_capacity._0_6_ = (undefined6)paVar16->_M_allocated_capacity;
          local_58._M_allocated_capacity._6_2_ =
               (undefined2)(paVar16->_M_allocated_capacity >> 0x30);
          local_68._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar13;
        }
        local_68._8_8_ = puVar13[1];
        *puVar13 = paVar16;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ParserContext::errorAtNextToken(local_38,Error,pTVar19,(string *)&local_68,&local_118);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_allocated_capacity != &local_58) {
          operator_delete((void *)local_68._M_allocated_capacity);
        }
        if (auStack_88 != (undefined1  [8])&stack0xffffffffffffff88) {
          operator_delete((void *)auStack_88);
        }
        if (local_b8 != local_a8) {
          operator_delete(local_b8);
        }
        this = (chatra *)local_40;
        _Var14._M_current = local_90._M_current;
        if (local_f8 != &local_e8) {
          operator_delete(local_f8);
          this = (chatra *)local_40;
          _Var14._M_current = local_90._M_current;
        }
      }
LAB_0018dff8:
      local_90._M_current = _Var14._M_current;
      if (ppStack_d8 != (pointer)0x0) {
        operator_delete(ppStack_d8);
      }
    }
    _Var14._M_current = local_90._M_current;
    puVar15 = (uint *)it->_M_current;
    if (local_90._M_current == (Token **)puVar15) {
      *(undefined8 *)this = 0;
      (((element_type *)this)->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
    }
    else {
      sVar23 = parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                         (this,local_38,
                          (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                           )puVar15,local_90);
      puVar15 = (uint *)sVar23.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
      it->_M_current = (Token **)_Var14;
    }
    peVar3 = *(element_type **)this;
    if (peVar3 == (element_type *)0x0) {
      bVar17 = true;
      bVar9 = false;
    }
    else {
      local_148.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (((element_type *)this)->line).
           super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((element_type *)
          local_148.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((element_type *)
                    local_148.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->fileName)._M_dataplus._M_p =
               *(int *)&(((element_type *)
                         local_148.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->fileName)._M_dataplus._M_p + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((element_type *)
                    local_148.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->fileName)._M_dataplus._M_p =
               *(int *)&(((element_type *)
                         local_148.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->fileName)._M_dataplus._M_p + 1;
        }
      }
      local_148.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
      sVar23 = wrapByTuple((chatra *)local_68._M_local_buf,&local_148,(Token *)0x0);
      uVar7 = local_68._8_8_;
      uVar5 = local_68._M_allocated_capacity;
      puVar15 = (uint *)sVar23.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
      local_68._M_allocated_capacity = 0;
      local_68._8_8_ = (element_type *)0x0;
      *(undefined8 *)local_40 = uVar5;
      peVar20 = (local_40->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      (local_40->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar7;
      if (peVar20 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar20);
        puVar15 = &extraout_RDX_03->type;
      }
      if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
        puVar15 = &extraout_RDX_04->type;
      }
      if ((element_type *)
          local_148.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_148.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        puVar15 = &extraout_RDX_05->type;
      }
      for (puVar13 = (undefined8 *)
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(uVar5 + 0x60))->_M_allocated_capacity;
          bVar9 = puVar13 == *(undefined8 **)(uVar5 + 0x68), !bVar9; puVar13 = puVar13 + 2) {
        puVar15 = (uint *)*puVar13;
        if ((*(char *)&((StatementPatternElement *)puVar15)->type != '\x1b') &&
           ((((StatementPatternElement *)((long)puVar15 + 0x38))->required != true ||
            (*(char *)**(undefined8 **)
                        &(((StatementPatternElement *)((long)puVar15 + 0x38))->errorMessage).field_2
             != '\x1b')))) {
          pTVar19 = *(Token **)(((StatementPatternElement *)puVar15)->errorMessage)._M_dataplus._M_p
          ;
          pTVar4 = *(Token **)
                    ((((StatementPatternElement *)puVar15)->errorMessage)._M_string_length - 8);
          local_68._M_allocated_capacity = (size_type)&local_58;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,"expected name [: value]","");
          auStack_88 = (undefined1  [8])0x0;
          itExp._M_current = (Token **)0x0;
          local_78._M_p = (pointer)0x0;
          ParserContext::errorAtToken
                    (local_38,Error,pTVar19,pTVar4,(string *)&local_68,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)auStack_88);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_88);
          puVar15 = &extraout_RDX_06->type;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_allocated_capacity != &local_58) {
            operator_delete((void *)local_68._M_allocated_capacity);
            puVar15 = &extraout_RDX_07->type;
          }
          break;
        }
      }
      bVar17 = !bVar9;
    }
    if (!bVar9) goto LAB_0018e9d5;
LAB_0018e9e7:
    this = (chatra *)local_40;
    if ((bVar17 & 1) == 0) goto LAB_0018eebb;
    break;
  case ForLoopVariables:
    ppTVar11 = it->_M_current;
    local_90._M_current = ppTVar11;
    if (ppTVar11 != last._M_current) {
      ppStack_d8 = (pointer)0x0;
      stack.
      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      stack.
      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      do {
        if ((ppStack_d8 ==
             stack.
             super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start) && ((*ppTVar11)->sid == In)) break;
        pTVar19 = *ppTVar11;
        if (pTVar19->type == CloseBracket) {
          SVar1 = pTVar19->sid;
          if (SVar1 == CloseBrace) {
            bVar9 = checkBracketPair(local_38,pTVar19,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)&ppStack_d8,OpenBrace);
          }
          else if (SVar1 == CloseBracket) {
            bVar9 = checkBracketPair(local_38,pTVar19,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)&ppStack_d8,OpenBracket);
          }
          else {
            if (SVar1 != CloseParenthesis) {
              local_58._M_allocated_capacity._0_6_ = 0x6e7265746e69;
              local_58._M_allocated_capacity._6_2_ = 0x6c61;
              local_58._8_6_ = 0x726f72726520;
              local_68._8_8_ = 0xe;
              local_58._M_local_buf[0xe] = '\0';
              auStack_88 = (undefined1  [8])0x0;
              itExp._M_current = (Token **)0x0;
              local_78._M_p = (pointer)0x0;
              local_68._M_allocated_capacity = (size_type)&local_58;
              ParserContext::errorAtToken
                        (local_38,Error,pTVar19,(string *)&local_68,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_88);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_88);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_allocated_capacity != &local_58) {
                operator_delete((void *)local_68._M_allocated_capacity);
              }
              puVar13 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar13 = &PTR__exception_002461d8;
              __cxa_throw(puVar13,&AbortCompilingException::typeinfo,std::exception::~exception);
            }
            bVar9 = checkBracketPair(local_38,pTVar19,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)&ppStack_d8,OpenParenthesis);
          }
          _Var14._M_current = local_90._M_current;
          if (bVar9 == false) goto LAB_0018e2a1;
        }
        else if (pTVar19->type == OpenBracket) {
          std::
          vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
          ::emplace_back<chatra::StringId_const&,chatra::Token_const*const&>
                    ((vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                      *)&ppStack_d8,&pTVar19->sid,ppTVar11);
        }
        ppTVar11 = ppTVar11 + 1;
      } while (ppTVar11 != last._M_current);
      _Var14._M_current = ppTVar11;
      if (ppStack_d8 !=
          stack.
          super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        _Var14._M_current = ppTVar11 + -1;
        if (ppTVar11 == local_90._M_current) {
          _Var14._M_current = local_90._M_current;
        }
        pTVar19 = *_Var14._M_current;
        local_e8 = 0x686374616d6e75;
        uStack_e1 = 0x27206465;
        local_f0 = 0xb;
        local_dd = 0;
        pbVar2 = (((local_38->sTable->
                   super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 idToStr).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar22 = *(long *)&pbVar2[stack.
                                  super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].first]._M_dataplus;
        local_f8 = &local_e8;
        local_b8 = local_a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,lVar22,
                   *(size_type *)
                    ((long)(pbVar2 + stack.
                                     super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-1].first) + 8) +
                   lVar22);
        uVar10 = 0xf;
        if (local_f8 != &local_e8) {
          uVar10 = CONCAT17((undefined1)uStack_e1,local_e8);
        }
        if (uVar10 < (ulong)(local_b0 + local_f0)) {
          uVar10 = 0xf;
          if (local_b8 != local_a8) {
            uVar10 = local_a8[0];
          }
          if (uVar10 < (ulong)(local_b0 + local_f0)) goto LAB_0018d48a;
          plVar12 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_b8,0,(char *)0x0,(ulong)local_f8);
        }
        else {
LAB_0018d48a:
          plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_b8);
        }
        auStack_88 = (undefined1  [8])&stack0xffffffffffffff88;
        pbVar2 = (pointer)(plVar12 + 2);
        if ((pointer)*plVar12 == pbVar2) {
          local_78._M_p = (pbVar2->_M_dataplus)._M_p;
          sStack_70 = plVar12[3];
        }
        else {
          local_78._M_p = (pbVar2->_M_dataplus)._M_p;
          auStack_88 = (undefined1  [8])*plVar12;
        }
        itExp._M_current = (Token **)plVar12[1];
        *plVar12 = (long)pbVar2;
        plVar12[1] = 0;
        *(undefined1 *)&(pbVar2->_M_dataplus)._M_p = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append(auStack_88);
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 == paVar16) {
          uVar5 = puVar13[3];
          local_58._M_allocated_capacity._0_6_ = (undefined6)paVar16->_M_allocated_capacity;
          local_58._M_allocated_capacity._6_2_ =
               (undefined2)(paVar16->_M_allocated_capacity >> 0x30);
          local_58._8_6_ = (undefined6)uVar5;
          local_58._M_local_buf[0xe] = (char)((ulong)uVar5 >> 0x30);
          local_58._M_local_buf[0xf] = (char)((ulong)uVar5 >> 0x38);
          local_68._M_allocated_capacity = (size_type)&local_58;
        }
        else {
          local_58._M_allocated_capacity._0_6_ = (undefined6)paVar16->_M_allocated_capacity;
          local_58._M_allocated_capacity._6_2_ =
               (undefined2)(paVar16->_M_allocated_capacity >> 0x30);
          local_68._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar13;
        }
        local_68._8_8_ = puVar13[1];
        *puVar13 = paVar16;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ParserContext::errorAtNextToken(local_38,Error,pTVar19,(string *)&local_68,&local_118);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_allocated_capacity != &local_58) {
          operator_delete((void *)local_68._M_allocated_capacity);
        }
        if (auStack_88 != (undefined1  [8])&stack0xffffffffffffff88) {
          operator_delete((void *)auStack_88);
        }
        if (local_b8 != local_a8) {
          operator_delete(local_b8);
        }
        this = (chatra *)local_40;
        _Var14._M_current = local_90._M_current;
        if (local_f8 != &local_e8) {
          operator_delete(local_f8);
          this = (chatra *)local_40;
          _Var14._M_current = local_90._M_current;
        }
      }
LAB_0018e2a1:
      local_90._M_current = _Var14._M_current;
      if (ppStack_d8 != (pointer)0x0) {
        operator_delete(ppStack_d8);
      }
    }
    _Var14._M_current = local_90._M_current;
    puVar15 = (uint *)it->_M_current;
    if (local_90._M_current == (Token **)puVar15) {
      *(undefined8 *)this = 0;
      (((element_type *)this)->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
    }
    else {
      sVar23 = parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                         (this,local_38,
                          (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                           )puVar15,local_90);
      puVar15 = (uint *)sVar23.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
      it->_M_current = (Token **)_Var14;
    }
    local_138.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)this;
    if (local_138.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      local_138.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (((element_type *)this)->line).
           super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((element_type *)
          local_138.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((element_type *)
                    local_138.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->fileName)._M_dataplus._M_p =
               *(int *)&(((element_type *)
                         local_138.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->fileName)._M_dataplus._M_p + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((element_type *)
                    local_138.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->fileName)._M_dataplus._M_p =
               *(int *)&(((element_type *)
                         local_138.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->fileName)._M_dataplus._M_p + 1;
        }
      }
      sVar23 = wrapByTuple((chatra *)local_68._M_local_buf,&local_138,(Token *)0x0);
      uVar7 = local_68._8_8_;
      uVar5 = local_68._M_allocated_capacity;
      puVar15 = (uint *)sVar23.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
      local_68._M_allocated_capacity = 0;
      local_68._8_8_ = (element_type *)0x0;
      peVar20 = (((element_type *)this)->line).
                super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      *(undefined8 *)this = uVar5;
      (((element_type *)this)->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar7;
      if (peVar20 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar20);
        puVar15 = &extraout_RDX_08->type;
      }
      local_1b0 = (element_type *)
                  local_138.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
      if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
        puVar15 = &extraout_RDX_09->type;
        local_1b0 = (element_type *)
                    local_138.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      }
      goto LAB_0018e543;
    }
LAB_0018e4f3:
    peVar20 = (((element_type *)this)->line).
              super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_0018e6c0:
    if (peVar20 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar20);
      puVar15 = &extraout_RDX_13->type;
    }
    break;
  case OperatorParameter:
    ppTVar11 = it->_M_current;
    if ((*ppTVar11)->sid == OpenParenthesis) {
      local_90._M_current = ppTVar11 + 1;
      if (local_90._M_current != last._M_current) {
        ppStack_d8 = (pointer)0x0;
        stack.
        super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        stack.
        super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        lVar22 = 8;
        do {
          __args_1 = (Token **)((long)ppTVar11 + lVar22);
          if ((ppStack_d8 ==
               stack.
               super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start) && ((*__args_1)->sid == CloseParenthesis))
          break;
          pTVar19 = *__args_1;
          if (pTVar19->type == CloseBracket) {
            SVar1 = pTVar19->sid;
            if (SVar1 == CloseBrace) {
              bVar9 = checkBracketPair(local_38,pTVar19,
                                       (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                        *)&ppStack_d8,OpenBrace);
            }
            else if (SVar1 == CloseBracket) {
              bVar9 = checkBracketPair(local_38,pTVar19,
                                       (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                        *)&ppStack_d8,OpenBracket);
            }
            else {
              if (SVar1 != CloseParenthesis) {
                local_58._M_allocated_capacity._0_6_ = 0x6e7265746e69;
                local_58._M_allocated_capacity._6_2_ = 0x6c61;
                local_58._8_6_ = 0x726f72726520;
                local_68._8_8_ = 0xe;
                local_58._M_local_buf[0xe] = '\0';
                auStack_88 = (undefined1  [8])0x0;
                itExp._M_current = (Token **)0x0;
                local_78._M_p = (pointer)0x0;
                local_68._M_allocated_capacity = (size_type)&local_58;
                ParserContext::errorAtToken
                          (local_38,Error,pTVar19,(string *)&local_68,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_88);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_88);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_allocated_capacity != &local_58) {
                  operator_delete((void *)local_68._M_allocated_capacity);
                }
                puVar13 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar13 = &PTR__exception_002461d8;
                __cxa_throw(puVar13,&AbortCompilingException::typeinfo,std::exception::~exception);
              }
              bVar9 = checkBracketPair(local_38,pTVar19,
                                       (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                        *)&ppStack_d8,OpenParenthesis);
            }
            _Var14._M_current = local_90._M_current;
            if (bVar9 == false) goto LAB_0018ebc8;
          }
          else if (pTVar19->type == OpenBracket) {
            std::
            vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
            ::emplace_back<chatra::StringId_const&,chatra::Token_const*const&>
                      ((vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                        *)&ppStack_d8,&pTVar19->sid,__args_1);
          }
          lVar6 = lVar22 + 8;
          lVar22 = lVar22 + 8;
        } while ((Token **)((long)ppTVar11 + lVar6) != last._M_current);
        _Var14._M_current = (Token **)((long)ppTVar11 + lVar22);
        if (ppStack_d8 !=
            stack.
            super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          _Var14._M_current = (Token **)((long)ppTVar11 + lVar22) + -1;
          if (lVar22 == 8) {
            _Var14._M_current = local_90._M_current;
          }
          pTVar19 = *_Var14._M_current;
          local_e8 = 0x686374616d6e75;
          uStack_e1 = 0x27206465;
          local_f0 = 0xb;
          local_dd = 0;
          pbVar2 = (((local_38->sTable->
                     super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   idToStr).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar22 = *(long *)&pbVar2[stack.
                                    super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].first]._M_dataplus
          ;
          local_f8 = &local_e8;
          local_b8 = local_a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,lVar22,
                     *(size_type *)
                      ((long)(pbVar2 + stack.
                                       super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[-1].first) + 8) +
                     lVar22);
          uVar10 = 0xf;
          if (local_f8 != &local_e8) {
            uVar10 = CONCAT17((undefined1)uStack_e1,local_e8);
          }
          if (uVar10 < (ulong)(local_b0 + local_f0)) {
            uVar10 = 0xf;
            if (local_b8 != local_a8) {
              uVar10 = local_a8[0];
            }
            if (uVar10 < (ulong)(local_b0 + local_f0)) goto LAB_0018d93f;
            plVar12 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_b8,0,(char *)0x0,(ulong)local_f8);
          }
          else {
LAB_0018d93f:
            plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_b8);
          }
          auStack_88 = (undefined1  [8])&stack0xffffffffffffff88;
          pbVar2 = (pointer)(plVar12 + 2);
          if ((pointer)*plVar12 == pbVar2) {
            local_78._M_p = (pbVar2->_M_dataplus)._M_p;
            sStack_70 = plVar12[3];
          }
          else {
            local_78._M_p = (pbVar2->_M_dataplus)._M_p;
            auStack_88 = (undefined1  [8])*plVar12;
          }
          itExp._M_current = (Token **)plVar12[1];
          *plVar12 = (long)pbVar2;
          plVar12[1] = 0;
          *(undefined1 *)&(pbVar2->_M_dataplus)._M_p = 0;
          puVar13 = (undefined8 *)std::__cxx11::string::append(auStack_88);
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 == paVar16) {
            uVar5 = puVar13[3];
            local_58._M_allocated_capacity._0_6_ = (undefined6)paVar16->_M_allocated_capacity;
            local_58._M_allocated_capacity._6_2_ =
                 (undefined2)(paVar16->_M_allocated_capacity >> 0x30);
            local_58._8_6_ = (undefined6)uVar5;
            local_58._M_local_buf[0xe] = (char)((ulong)uVar5 >> 0x30);
            local_58._M_local_buf[0xf] = (char)((ulong)uVar5 >> 0x38);
            local_68._M_allocated_capacity = (size_type)&local_58;
          }
          else {
            local_58._M_allocated_capacity._0_6_ = (undefined6)paVar16->_M_allocated_capacity;
            local_58._M_allocated_capacity._6_2_ =
                 (undefined2)(paVar16->_M_allocated_capacity >> 0x30);
            local_68._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar13;
          }
          local_68._8_8_ = puVar13[1];
          *puVar13 = paVar16;
          puVar13[1] = 0;
          *(undefined1 *)(puVar13 + 2) = 0;
          local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ParserContext::errorAtNextToken(local_38,Error,pTVar19,(string *)&local_68,&local_118);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_allocated_capacity != &local_58) {
            operator_delete((void *)local_68._M_allocated_capacity);
          }
          if (auStack_88 != (undefined1  [8])&stack0xffffffffffffff88) {
            operator_delete((void *)auStack_88);
          }
          if (local_b8 != local_a8) {
            operator_delete(local_b8);
          }
          _Var14._M_current = local_90._M_current;
          if (local_f8 != &local_e8) {
            operator_delete(local_f8);
            _Var14._M_current = local_90._M_current;
          }
        }
LAB_0018ebc8:
        local_90._M_current = _Var14._M_current;
        if (ppStack_d8 != (pointer)0x0) {
          operator_delete(ppStack_d8);
        }
      }
      ct_00 = local_38;
      peVar3 = local_40;
      _Var14._M_current = local_90._M_current;
      puVar15 = (uint *)(it->_M_current + 1);
      iVar18 = 2;
      if ((local_90._M_current != last._M_current && local_90._M_current != (Token **)puVar15) &&
         ((*local_90._M_current)->sid == CloseParenthesis)) {
        parseOperatorParameter<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                  ((chatra *)local_40,local_38,
                   (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                    )puVar15,local_90);
        bVar9 = checkAsOperatorParameter(ct_00,(shared_ptr<chatra::Node> *)peVar3);
        iVar18 = 2;
        puVar15 = &extraout_RDX_23->type;
        if (!bVar9) {
          this_00._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (local_40->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          goto LAB_0018ee59;
        }
        it->_M_current = _Var14._M_current + 1;
        iVar18 = 1;
      }
      goto LAB_0018ee63;
    }
  }
LAB_0018ee68:
  peVar3 = local_40;
  if (local_120->required == true) {
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_58._M_allocated_capacity._0_6_ = 0;
    local_58._M_allocated_capacity._6_2_ = 0;
    ParserContext::errorAtToken
              (local_38,Error,*local_128,&local_120->errorMessage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_68);
    puVar15 = &extraout_RDX_32->type;
  }
  *(undefined8 *)peVar3 = 0;
  (peVar3->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this = (chatra *)local_40;
LAB_0018eebb:
  sVar23.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar15;
  sVar23.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<chatra::Node>)
         sVar23.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Node> extractStatementPiece(ParserContext& ct, TokenPtrIterator& it, TokenPtrIterator last,
		const StatementPatternElement& e) {

	chatra_assert(it != last);
	auto it0 = it;
	auto leftTokens = static_cast<size_t>(std::distance(it, last));

	switch (e.type) {
	case StPt::Token:
		if (matches(**it, e.token))
			return createNameNode(**it++);
		break;

	case StPt::Name:
		if (matches(**it, TokenType::Name))
			return createNameNode(**it++);
		break;

	case StPt::VariationName:
		if (leftTokens >= 2 && matches(**it, StringId::OpElementSelection) && matches(**(it + 1), TokenType::Name)) {
			// Variation name is distinguishable from reserved words since it is always used with prefixed ".";
			// No checks performed.
			auto n = createNameNode(**(it + 1));
			it += 2;
			return n;
		}
		break;

	case StPt::Label:
		if (matches(**it, TokenType::Name))
			return createNameNode(**it++);
		break;

	case StPt::LabelWithColon:
		if (leftTokens >= 2 && matches(**it, TokenType::Name) && matches(**(it + 1), StringId::Colon)) {
			auto n = createNameNode(**it);
			it += 2;
			return n;
		}
		break;

	case StPt::StorageClassSpecifier:
		// Currently only supports "static"
		if (matches(**it, StringId::Static))
			return wrapByTuple(createNameNode(**it++));
		break;

	case StPt::Expression: {
		auto n = extractExpression(ct, it, last, [](const Token& token) { (void)token; return false; });
		if (!n)
			break;
		return n;
	}

	case StPt::TupleExpression: {
		auto n = extractExpression(ct, it, last, [](const Token& token) { (void)token; return false; });
		if (!n)
			break;
		if (isOperator(n, Operator::Pair))
			n = wrapByTuple(n);
		return n;
	}

	case StPt::ParameterList:
		if (matches(**it, StringId::OpenParenthesis)) {
			auto itBoundary = findExpressionBoundary(ct, it + 1, last, [](const Token& token) {
					return matches(token, StringId::CloseParenthesis); });
			// Empty parameter list means "void" function, so it should be accepted
			if (itBoundary == last || !matches(**itBoundary, StringId::CloseParenthesis))
				break;
			if (itBoundary == it + 1) {
				auto itHint = it;
				it += 2;
				return wrapByTuple(nullptr, *itHint);
			}

			auto n = wrapByTuple(parseExpression(ct, it + 1, itBoundary));
			if (!checkAsParameterList(ct, n))
				break;
			it = itBoundary + 1;
			return n;
		}
		break;

	case StPt::Qualifiers:
		if (leftTokens >= 2 && matches(**it, StringId::As)) {
			auto itExp = it + 1;
			auto n = extractExpression(ct, itExp, last, [](const Token& token) { (void)token; return false; });
			if (!n)
				break;
			n = wrapByTuple(n);
			if (!checkAsQualifiers(ct, n))
				break;
			it = itExp;
			return n;
		}
		break;

	case StPt::ClassList: {
		auto n = extractExpression(ct, it, last, [](const Token& token) { (void)token; return false; });
		if (!n)
			break;
		n = wrapByTuple(n);
		if (!checkAsClassList(ct, n))
			break;
		return n;
	}

	case StPt::VarDefinitions: {
		auto n = extractExpression(ct, it, last, [](const Token& token) { return matches(token, StringId::As); });
		if (!n)
			break;
		n = wrapByTuple(n);
		if (!checkAsVarDefinitions(ct, n))
			break;
		return n;
	}

	case StPt::ForLoopVariables: {
		auto n = extractExpression(ct, it, last, [](const Token& token) { return matches(token, StringId::In); });
		if (!n)
			break;
		n = wrapByTuple(n);
		// if (!checkAsForLoopVariables(ct, n))
		// 	break;
		return n;
	}

	case StPt::OperatorParameter:
		if (matches(**it, StringId::OpenParenthesis)) {
			auto itBoundary = findExpressionBoundary(ct, it + 1, last, [](const Token& token) {
				return matches(token, StringId::CloseParenthesis); });
			if (itBoundary == it + 1 || itBoundary == last || !matches(**itBoundary, StringId::CloseParenthesis))
				break;

			auto n = parseOperatorParameter(ct, it + 1, itBoundary);
			if (!checkAsOperatorParameter(ct, n))
				break;
			it = itBoundary + 1;
			return n;
		}
		break;
	}

	if (e.required) {
		chatra_assert(!e.errorMessage.empty());
		ct.errorAtToken(ErrorLevel::Error, **it0, e.errorMessage, {});
	}

	return nullptr;
}